

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_tar_acl.c
# Opt level: O3

void test_compat_solaris_tar_acl(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  archive_entry *ae;
  char name [32];
  archive_entry *local_60;
  char local_58 [40];
  
  builtin_strncpy(local_58 + 0x10,"ris_tar_acl.tar",0x10);
  builtin_strncpy(local_58,"test_compat_sola",0x10);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'Ù',(uint)(a != (archive_conflict *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(local_58);
  wVar2 = archive_read_open_filename(a,local_58,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Þ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)"
                      ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'á',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  failure("One extended ACL should flag all ACLs to be returned.");
  wVar2 = archive_entry_acl_reset(local_60,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ä',7,"7",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'æ',local_60,(archive_test_acl_t *)acls0,L'\a',L'Ā',L'Ƥ');
  mVar3 = archive_entry_mode(local_60);
  failure("Basic ACLs should set mode to 0644, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'é',(uint)((mVar3 & 0x1ff) == 0x1a4),"(archive_entry_mode(ae) & 0777) == 0644"
                   ,(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ì',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_acl_reset(local_60,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'î',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'ð',local_60,(archive_test_acl_t *)acls1,L'\x06',L'Ā',L'Ǩ');
  mVar3 = archive_entry_mode(local_60);
  failure("Basic ACLs should set mode to 0750, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ó',(uint)((mVar3 & 0x1ff) == 0x1e8),"(archive_entry_mode(ae) & 0777) == 0750"
                   ,(void *)0x0);
  wVar2 = archive_entry_acl_reset(local_60,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'õ',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'÷',local_60,(archive_test_acl_t *)acls2,L'\x06',L'Ȁ',L'Ǩ');
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ú',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_acl_reset(local_60,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ü',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'þ',local_60,(archive_test_acl_t *)acls3,L'\x06',L'㰀',L'\0');
  iVar1 = archive_read_next_header((archive *)a,&local_60);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ā',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_acl_reset(local_60,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ă',5,"5",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'ą',local_60,(archive_test_acl_t *)acls4,L'\x05',L'㰀',L'\0');
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_solaris_tar_acl)
{
	char name[] = "test_compat_solaris_tar_acl.tar";
	struct archive *a;
	struct archive_entry *ae;

	/* Read archive file */
	assert(NULL != (a = archive_read_new()));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
        extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name,
	    10240));

	/* First item has access ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("One extended ACL should flag all ACLs to be returned.");
	assertEqualInt(7, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0644);
	failure("Basic ACLs should set mode to 0644, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0644);

	/* Second item has default and access ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0750);
	failure("Basic ACLs should set mode to 0750, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0750);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT, 0750);

	/* Third item has NFS4 ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls3, sizeof(acls3)/sizeof(acls3[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Fourth item has NFS4 ACLs and inheritance flags */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(5, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls4, sizeof(acls4)/sizeof(acls0[4]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}